

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O2

void __thiscall
Animation_Constraint::Invalidated
          (Animation_Constraint *this,Am_Slot *param_1,Am_Constraint *param_2,Am_Value *param_3)

{
  return;
}

Assistant:

void
Animation_Constraint::Invalidated(const Am_Slot & /* slot */,
                                  Am_Constraint * /* invalidating_constraint */,
                                  const Am_Value & /* new_value */)
{
  // std::cout << "Animation_Constraint::Invalidated " << slot.Get_Key() << ", " <<
  //  invalidating_constraint <<std::endl;
  //   if ((invalidating_constraint != this) && interpolator.Valid()) {
  //     Am_Value uninit;
  //     uninit.Set_Uninitialized();

  //     Set_Target_Value (slot, uninit);
  //   }
}